

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O1

GLSLVersion glu::getContextTypeGLSLVersion(ContextType type)

{
  bool bVar1;
  int version;
  GLSLVersion version_00;
  
  version_00 = GLSL_VERSION_450;
  do {
    bVar1 = isGLSLVersionSupported(type,version_00);
    if (bVar1) {
      return version_00;
    }
    bVar1 = version_00 != GLSL_VERSION_100_ES;
    version_00 = version_00 - GLSL_VERSION_300_ES;
  } while (bVar1);
  return GLSL_VERSION_LAST;
}

Assistant:

GLSLVersion getContextTypeGLSLVersion (ContextType type)
{
	// \note From newer to older
	for (int version = GLSL_VERSION_LAST-1; version >= 0; version--)
	{
		if (isGLSLVersionSupported(type, GLSLVersion(version)))
			return GLSLVersion(version);
	}

	DE_ASSERT(false);
	return GLSL_VERSION_LAST;
}